

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O3

bool __thiscall
psy::C::Parser::parseParenthesizedTypeNameOrExpression(Parser *this,TypeReferenceSyntax **tyRef)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *pSVar3;
  ExpressionAsTypeReferenceSyntax *pEVar4;
  IndexType IVar5;
  TypeNameAsTypeReferenceSyntax *pTVar6;
  TypeNameSyntax *typeName;
  ExpressionSyntax *expr;
  Backtracker BT;
  TypeNameSyntax *local_98;
  ExpressionSyntax *local_90;
  Backtracker local_88;
  
  pSVar3 = peek(this,1);
  if (pSVar3->syntaxK_ == OpenParenToken) {
    Backtracker::Backtracker(&local_88,this,0);
    local_90 = (ExpressionSyntax *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,&local_90);
    if (bVar1) {
      pEVar4 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *tyRef = &pEVar4->super_TypeReferenceSyntax;
      pEVar4->expr_ = local_90;
      SVar2 = SyntaxNode::kind(&local_90->super_SyntaxNode);
      bVar1 = true;
      if (SVar2 == ParenthesizedExpression) {
        maybeAmbiguateTypeReference(this,tyRef);
      }
    }
    else {
      Backtracker::backtrack(&local_88);
      IVar5 = consume(this);
      local_98 = (TypeNameSyntax *)0x0;
      bVar1 = parseTypeName(this,&local_98);
      if (bVar1) {
        pTVar6 = makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
        *tyRef = &pTVar6->super_TypeReferenceSyntax;
        pTVar6->openParenTkIdx_ = IVar5;
        pTVar6->typeName_ = local_98;
        bVar1 = matchOrSkipTo(this,CloseParenToken,&pTVar6->closeParenTkIdx_);
      }
      else {
        bVar1 = false;
      }
    }
    Backtracker::~Backtracker(&local_88);
  }
  else {
    local_88.parser_ = (Parser *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,(ExpressionSyntax **)&local_88);
    if (bVar1) {
      pEVar4 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *tyRef = &pEVar4->super_TypeReferenceSyntax;
      pEVar4->expr_ = (ExpressionSyntax *)local_88.parser_;
    }
  }
  return bVar1;
}

Assistant:

bool Parser::parseParenthesizedTypeNameOrExpression(TypeReferenceSyntax*& tyRef)
{
    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            Backtracker BT(this);
            ExpressionSyntax* expr = nullptr;
            if (parseExpressionWithPrecedenceUnary(expr)) {
                auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
                tyRef = exprAsTyRef;
                exprAsTyRef->expr_ = expr;
                if (expr->kind() == SyntaxKind::ParenthesizedExpression)
                    maybeAmbiguateTypeReference(tyRef);
                return true;
            }

            BT.backtrack();
            auto openParenTkIdx = consume();
            TypeNameSyntax* typeName = nullptr;
            if (!parseTypeName(typeName))
                return false;

            auto nameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
            tyRef = nameAsTyRef;
            nameAsTyRef->openParenTkIdx_ = openParenTkIdx;
            nameAsTyRef->typeName_ = typeName;
            return matchOrSkipTo(SyntaxKind::CloseParenToken, &nameAsTyRef->closeParenTkIdx_);
        }

        default: {
            ExpressionSyntax* unaryExpr = nullptr;
            if (!parseExpressionWithPrecedenceUnary(unaryExpr))
                return false;
            auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
            tyRef = exprAsTyRef;
            exprAsTyRef->expr_ = unaryExpr;
            return true;
        }
    }
}